

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButton::setChecked(QAbstractButton *this,bool checked)

{
  byte bVar1;
  QAbstractButtonPrivate *this_00;
  QButtonGroupPrivate *this_01;
  bool bVar2;
  QAbstractButton *pQVar3;
  byte bVar4;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_68;
  code *local_50;
  undefined8 local_48;
  QAbstractButton *pQStack_40;
  undefined8 local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  bVar4 = this_00->field_0x28c;
  if (((bVar4 & 1) == 0) || (((bVar4 & 2) == 0) != checked)) {
    if ((bVar4 & 0x20) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this);
        return;
      }
      goto LAB_0039b0e5;
    }
    goto LAB_0039b097;
  }
  bVar4 = 2;
  if (checked) {
LAB_0039afbb:
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QAbstractButton>::QPointer<void>((QPointer<QAbstractButton> *)&local_68,this);
    bVar1 = this_00->field_0x28c;
    this_00->field_0x28c = bVar1 & 0xfd | bVar4;
    if ((bVar1 & 0x20) == 0) {
      (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this);
    }
    QAbstractButtonPrivate::refresh(this_00);
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
    if (bVar2 && checked) {
      QAbstractButtonPrivate::notifyChecked(this_00);
    }
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
    if (bVar2) {
      QAbstractButtonPrivate::emitToggled(this_00,checked);
    }
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&local_68);
    if (bVar2) {
      local_38 = 0xaaaaaaaaffffffff;
      local_50 = QCss::ValueExtractor::extractGeometry;
      local_30 = 0x40;
      local_48 = 0xaaaaaaaa0000800a;
      pQStack_40 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
                ((QAccessibleStateChangeEvent *)&local_50);
    }
    QWeakPointer<QObject>::~QWeakPointer(&local_68);
  }
  else {
    pQVar3 = QAbstractButtonPrivate::queryCheckedButton(this_00);
    if (pQVar3 != this) {
LAB_0039afb8:
      bVar4 = 0;
      goto LAB_0039afbb;
    }
    if (this_00->group == (QButtonGroup *)0x0) {
      if ((this_00->field_0x28c & 8) == 0) goto LAB_0039afb8;
    }
    else {
      this_01 = *(QButtonGroupPrivate **)&this_00->group->field_0x8;
      if (this_01->exclusive == false) {
        QButtonGroupPrivate::detectCheckedButton(this_01);
        goto LAB_0039afb8;
      }
    }
  }
LAB_0039b097:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0039b0e5:
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::setChecked(bool checked)
{
    Q_D(QAbstractButton);
    if (!d->checkable || d->checked == checked) {
        if (!d->blockRefresh)
            checkStateSet();
        return;
    }

    if (!checked && d->queryCheckedButton() == this) {
        // the checked button of an exclusive or autoexclusive group cannot be  unchecked
#if QT_CONFIG(buttongroup)
        if (d->group ? d->group->d_func()->exclusive : d->autoExclusive)
            return;
        if (d->group)
            d->group->d_func()->detectCheckedButton();
#else
        if (d->autoExclusive)
            return;
#endif
    }

    QPointer<QAbstractButton> guard(this);

    d->checked = checked;
    if (!d->blockRefresh)
        checkStateSet();
    d->refresh();

    if (guard && checked)
        d->notifyChecked();
    if (guard)
        d->emitToggled(checked);

#if QT_CONFIG(accessibility)
    if (guard) {
        QAccessible::State s;
        s.checked = true;
        QAccessibleStateChangeEvent event(this, s);
        QAccessible::updateAccessibility(&event);
    }
#endif
}